

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.hpp
# Opt level: O2

void boost::python::detail::
     def_init_aux<boost::python::class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>,boost::python::default_call_policies,boost::mpl::vector0<mpl_::na>,boost::mpl::size<boost::mpl::vector0<mpl_::na>>>
               (class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
                *cl,undefined8 param_2,keyword_range *param_3,char *param_4)

{
  object_base oStack_28;
  char *local_20;
  
  local_20 = param_4;
  make_keyword_range_function<void(*)(_object*),boost::python::default_call_policies>
            ((_func_void__object_ptr *)&oStack_28,
             (default_call_policies *)
             objects::make_holder<0>::
             apply<boost::python::objects::value_holder<StimulationCommand>,_boost::mpl::vector0<mpl_::na>_>
             ::execute,param_3);
  class_<StimulationCommand,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>
  ::def<boost::python::api::object,char_const*>(cl,"__init__",(object *)&oStack_28,&local_20);
  api::object_base::~object_base(&oStack_28);
  return;
}

Assistant:

inline void def_init_aux(
      ClassT& cl
      , Signature const&
      , NArgs
      , CallPoliciesT const& policies
      , char const* doc
      , detail::keyword_range const& keywords_
      )
  {
      cl.def(
          "__init__"
        , detail::make_keyword_range_constructor<Signature,NArgs>(
              policies
            , keywords_
            , (typename ClassT::metadata::holder*)0
          )
        , doc
      );
  }